

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

boolean decode_mcu_DC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  d_derived_tbl *htbl;
  jpeg_source_mgr *pjVar4;
  bool bVar5;
  boolean bVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  _func_void_j_decompress_ptr *get_buffer;
  int bits_left;
  uint unaff_R13D;
  long lVar11;
  bitread_working_state br_state;
  savable_state state;
  bitread_working_state local_80;
  undefined8 local_58;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Stack_50;
  undefined4 local_48;
  JBLOCKROW *local_40;
  long local_38;
  
  local_40 = MCU_data;
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Al;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar6 = process_restart(cinfo), bVar6 != 0)) {
    if (*(int *)((long)&pjVar2[3].start_pass + 4) == 0) {
      local_80.next_input_byte = cinfo->src->next_input_byte;
      local_80.bytes_in_buffer = cinfo->src->bytes_in_buffer;
      get_buffer = pjVar2[1].start_pass;
      bits_left = *(int *)&pjVar2[1].decode_mcu;
      local_48 = *(undefined4 *)&pjVar2[3].start_pass;
      local_58 = pjVar2[2].start_pass;
      p_Stack_50 = pjVar2[2].decode_mcu;
      if (0 < cinfo->blocks_in_MCU) {
        lVar11 = 0;
        local_80.cinfo = cinfo;
        do {
          paJVar3 = local_40[lVar11];
          local_38 = (long)cinfo->MCU_membership[lVar11];
          htbl = (d_derived_tbl *)
                 (&pjVar2[4].start_pass)
                 [cinfo->cur_comp_info[cinfo->MCU_membership[lVar11]]->dc_tbl_no];
          if (bits_left < 8) {
            bVar6 = jpeg_fill_bit_buffer(&local_80,(bit_buf_type)get_buffer,bits_left,0);
            if (bVar6 != 0) {
              iVar10 = 1;
              get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer;
              bits_left = local_80.bits_left;
              if (7 < local_80.bits_left) goto LAB_002849d0;
              goto LAB_00284a06;
            }
LAB_00284a35:
            bVar5 = false;
          }
          else {
LAB_002849d0:
            uVar7 = (long)get_buffer >> ((char)bits_left - 8U & 0x3f) & 0xff;
            if (htbl->look_nbits[uVar7] == 0) {
              iVar10 = 9;
LAB_00284a06:
              unaff_R13D = jpeg_huff_decode(&local_80,(bit_buf_type)get_buffer,bits_left,htbl,iVar10
                                           );
              if ((int)unaff_R13D < 0) goto LAB_00284a35;
              bVar5 = true;
              get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer;
              bits_left = local_80.bits_left;
            }
            else {
              unaff_R13D = (uint)htbl->look_sym[uVar7];
              bVar5 = true;
              bits_left = bits_left - htbl->look_nbits[uVar7];
            }
          }
          if (!bVar5) goto LAB_00284b18;
          if (unaff_R13D == 0) {
            iVar10 = 0;
          }
          else {
            if ((bits_left < (int)unaff_R13D) &&
               (bVar6 = jpeg_fill_bit_buffer
                                  (&local_80,(bit_buf_type)get_buffer,bits_left,unaff_R13D),
               get_buffer = (_func_void_j_decompress_ptr *)local_80.get_buffer,
               bits_left = local_80.bits_left, bVar6 == 0)) goto LAB_00284b18;
            bits_left = bits_left - unaff_R13D;
            uVar8 = bmask[(int)unaff_R13D];
            uVar9 = (uint)((long)get_buffer >> ((byte)bits_left & 0x3f)) & uVar8;
            if (jpeg_zigzag_order[7][(long)(int)unaff_R13D + 7] < (int)uVar9) {
              uVar8 = 0;
            }
            iVar10 = uVar9 - uVar8;
          }
          unaff_R13D = iVar10 + *(int *)((long)&local_58 + local_38 * 4 + 4);
          *(uint *)((long)&local_58 + local_38 * 4 + 4) = unaff_R13D;
          (*paJVar3)[0] = (JCOEF)(unaff_R13D << ((byte)iVar1 & 0x1f));
          lVar11 = lVar11 + 1;
        } while (lVar11 < cinfo->blocks_in_MCU);
      }
      pjVar4 = cinfo->src;
      pjVar4->next_input_byte = local_80.next_input_byte;
      pjVar4->bytes_in_buffer = local_80.bytes_in_buffer;
      pjVar2[1].start_pass = get_buffer;
      *(int *)&pjVar2[1].decode_mcu = bits_left;
      *(undefined4 *)&pjVar2[3].start_pass = local_48;
      pjVar2[2].start_pass = local_58;
      pjVar2[2].decode_mcu = p_Stack_50;
    }
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    bVar6 = 1;
  }
  else {
LAB_00284b18:
    bVar6 = 0;
  }
  return bVar6;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign;
  int v, m;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    tbl = cinfo->cur_comp_info[ci]->dc_tbl_no;

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    /* Scale and output the DC coefficient (assumes jpeg_natural_order[0]=0) */
    (*block)[0] = (JCOEF) (entropy->last_dc_val[ci] << cinfo->Al);
  }

  return TRUE;
}